

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_damped_harmonic_symplectic.c
# Opt level: O3

int qdot(sunrealtype t,N_Vector yvec,N_Vector ydotvec,void *user_data)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  double dVar4;
  
  pdVar2 = (double *)N_VGetArrayPointer();
  lVar3 = N_VGetArrayPointer(ydotvec);
  dVar1 = *pdVar2;
  dVar4 = sin(t / 3.141592653589793);
  dVar4 = exp(dVar4 * -0.018);
  *(double *)(lVar3 + 8) = dVar4 * dVar1;
  return 0;
}

Assistant:

int qdot(sunrealtype t, N_Vector yvec, N_Vector ydotvec, void* user_data)
{
  sunrealtype* y      = N_VGetArrayPointer(yvec);
  sunrealtype* ydot   = N_VGetArrayPointer(ydotvec);
  const sunrealtype p = y[0];

  ydot[1] = p * exp(-F(t));

  return 0;
}